

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

CharIterator * __thiscall
absl::lts_20250127::Cord::Find(CharIterator *__return_storage_ptr__,Cord *this,string_view needle)

{
  bool bVar1;
  Cord *pCVar2;
  char *pcVar3;
  long lVar4;
  Cord *lhs;
  ChunkIterator *this_00;
  size_t *psVar5;
  byte bVar6;
  string_view rhs;
  ChunkIterator in_stack_fffffffffffffea8;
  ChunkIterator local_c0;
  
  lhs = (Cord *)needle._M_len;
  bVar6 = 0;
  if (lhs == (Cord *)0x0) {
LAB_00ce6d62:
    ChunkIterator::ChunkIterator(&__return_storage_ptr__->chunk_iterator_,this);
  }
  else {
    pcVar3 = needle._M_str;
    pCVar2 = (Cord *)InlineRep::size(&this->contents_);
    if (lhs <= pCVar2) {
      pCVar2 = (Cord *)InlineRep::size(&this->contents_);
      if (pCVar2 != lhs) {
        ChunkIterator::ChunkIterator(&local_c0,this);
        this_00 = &local_c0;
        psVar5 = (size_t *)&stack0xfffffffffffffea8;
        for (lVar4 = 0x13; lVar4 != 0; lVar4 = lVar4 + -1) {
          *psVar5 = (this_00->current_chunk_)._M_len;
          this_00 = (ChunkIterator *)((long)this_00 + (ulong)bVar6 * -0x10 + 8);
          psVar5 = psVar5 + (ulong)bVar6 * -2 + 1;
        }
        FindImpl(__return_storage_ptr__,(Cord *)this_00,(CharIterator)in_stack_fffffffffffffea8,
                 needle);
        return __return_storage_ptr__;
      }
      rhs._M_str = pcVar3;
      rhs._M_len = (size_t)needle._M_str;
      bVar1 = lts_20250127::operator==((lts_20250127 *)this,lhs,rhs);
      if (bVar1) goto LAB_00ce6d62;
    }
    memset(__return_storage_ptr__,0,0x98);
    (__return_storage_ptr__->chunk_iterator_).btree_reader_.navigator_.height_ = -1;
  }
  return __return_storage_ptr__;
}

Assistant:

absl::Cord::CharIterator absl::Cord::Find(absl::string_view needle) const {
  if (needle.empty()) {
    return char_begin();
  }
  if (needle.size() > size()) {
    return char_end();
  }
  if (needle.size() == size()) {
    return *this == needle ? char_begin() : char_end();
  }
  return FindImpl(char_begin(), needle);
}